

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::renderShadowMap(SceneRender *this,Uniforms *_uniforms)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Shader *pSVar20;
  long lVar21;
  Light *this_00;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  mapped_type *ppSVar35;
  mat4 *pmVar36;
  float *pfVar37;
  _Rb_tree_node_base *p_Var38;
  _Base_ptr p_Var39;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  undefined1 local_130 [8];
  float fStack_128;
  float fStack_124;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  string local_f0;
  Tracker *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  _Base_ptr local_78;
  undefined8 uStack_70;
  _Rb_tree_node_base *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Model *local_48;
  ShaderMap *local_40;
  _Base_ptr local_38;
  
  if (this->m_shadows == true) {
    local_d0 = &_uniforms->tracker;
    if ((_uniforms->tracker).m_running == true) {
      local_130 = (undefined1  [8])&local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"render:scene:shadowmap","");
      Tracker::begin(local_d0,(string *)local_130);
      if (local_130 != (undefined1  [8])&local_120) {
        operator_delete((void *)local_130,
                        CONCAT44(local_120._M_allocated_capacity._4_4_,
                                 local_120._M_allocated_capacity._0_4_) + 1);
      }
    }
    p_Var39 = (_uniforms->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(_uniforms->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var39 != local_38) {
      local_48 = &this->m_floor;
      local_40 = &(this->m_floor).gBuffersShaders;
      local_60 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        if (((this->dynamicShadows != false) ||
            (((*(Light **)(p_Var39 + 2))->super_Node).bChange != false)) ||
           ((this->m_origin).bChange == true)) {
          vera::Light::bindShadowMap(*(Light **)(p_Var39 + 2));
          local_130 = (undefined1  [8])&local_120;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"shadow","");
          ppSVar35 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                     ::operator[](local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_130);
          pSVar20 = *ppSVar35;
          if (local_130 != (undefined1  [8])&local_120) {
            operator_delete((void *)local_130,
                            CONCAT44(local_120._M_allocated_capacity._4_4_,
                                     local_120._M_allocated_capacity._0_4_) + 1);
          }
          if ((pSVar20 != (Shader *)0x0) && ((this->m_floor).m_model_vbo != (Vbo *)0x0)) {
            if ((_uniforms->tracker).m_running == true) {
              local_130 = (undefined1  [8])&local_120;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_130,"render:scene:shadowmap:floor","");
              Tracker::begin(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130);
              if (local_130 != (undefined1  [8])&local_120) {
                operator_delete((void *)local_130,
                                CONCAT44(local_120._M_allocated_capacity._4_4_,
                                         local_120._M_allocated_capacity._0_4_) + 1);
              }
            }
            vera::Shader::use(pSVar20);
            (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar20,0);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"u_modelViewProjectionMatrix","");
            local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
            local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
            local_a8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
            local_a8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
            uStack_a0 = 0;
            uVar4 = (this->m_origin).m_transformMatrix.value[1].field_0;
            uVar12 = (this->m_origin).m_transformMatrix.value[1].field_1;
            local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
            local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
            uStack_b0 = 0;
            local_98._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
            local_98._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
            uStack_90 = 0;
            local_78._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
            local_78._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
            uStack_70 = 0;
            uVar5 = (this->m_origin).m_transformMatrix.value[3].field_0;
            uVar13 = (this->m_origin).m_transformMatrix.value[3].field_1;
            local_88._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
            local_88._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
            uStack_80 = 0;
            fVar1 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
            fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
            fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
            fVar22 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
            fVar23 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
            fVar24 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
            uStack_c0 = 0;
            fVar25 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
            fVar26 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
            fVar27 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
            fStack_128 = fVar22 * (float)(undefined4)local_88 +
                         fVar3 * (float)local_78._0_4_ +
                         fVar2 * (float)(undefined4)local_b8 + fVar1 * (float)(undefined4)local_a8;
            fStack_124 = fVar22 * (float)local_88._4_4_ +
                         fVar3 * (float)local_78._4_4_ +
                         fVar2 * (float)local_b8._4_4_ + fVar1 * (float)local_a8._4_4_;
            fVar28 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
            fVar29 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
            fVar30 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
            fVar31 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
            fVar32 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
            fVar33 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
            fVar34 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
            local_130._4_4_ =
                 (float)uVar13 * fVar22 +
                 (float)local_98._4_4_ * fVar3 +
                 (float)uVar12 * fVar2 + (float)local_c8._4_4_ * fVar1;
            local_130._0_4_ =
                 (float)uVar5 * fVar22 +
                 (float)(undefined4)local_98 * fVar3 +
                 (float)uVar4 * fVar2 + (float)(undefined4)local_c8 * fVar1;
            local_120._M_allocated_capacity._0_4_ =
                 (float)uVar5 * fVar26 +
                 (float)(undefined4)local_98 * fVar25 +
                 (float)uVar4 * fVar24 + (float)(undefined4)local_c8 * fVar23;
            local_120._M_allocated_capacity._4_4_ =
                 (float)uVar13 * fVar26 +
                 (float)local_98._4_4_ * fVar25 +
                 (float)uVar12 * fVar24 + (float)local_c8._4_4_ * fVar23;
            local_120._8_4_ =
                 fVar26 * (float)(undefined4)local_88 +
                 fVar25 * (float)local_78._0_4_ +
                 fVar24 * (float)(undefined4)local_b8 + fVar23 * (float)(undefined4)local_a8;
            local_120._12_4_ =
                 fVar26 * (float)local_88._4_4_ +
                 fVar25 * (float)local_78._4_4_ +
                 fVar24 * (float)local_b8._4_4_ + fVar23 * (float)local_a8._4_4_;
            local_110 = (float)uVar5 * fVar30 +
                        (float)(undefined4)local_98 * fVar29 +
                        (float)uVar4 * fVar28 + (float)(undefined4)local_c8 * fVar27;
            fStack_10c = (float)uVar13 * fVar30 +
                         (float)local_98._4_4_ * fVar29 +
                         (float)uVar12 * fVar28 + (float)local_c8._4_4_ * fVar27;
            fStack_108 = fVar30 * (float)(undefined4)local_88 +
                         fVar29 * (float)local_78._0_4_ +
                         fVar28 * (float)(undefined4)local_b8 + fVar27 * (float)(undefined4)local_a8
            ;
            fStack_104 = fVar30 * (float)local_88._4_4_ +
                         fVar29 * (float)local_78._4_4_ +
                         fVar28 * (float)local_b8._4_4_ + fVar27 * (float)local_a8._4_4_;
            local_100 = (float)uVar5 * fVar34 +
                        (float)(undefined4)local_98 * fVar33 +
                        (float)uVar4 * fVar32 + (float)(undefined4)local_c8 * fVar31;
            fStack_fc = (float)uVar13 * fVar34 +
                        (float)local_98._4_4_ * fVar33 +
                        (float)uVar12 * fVar32 + (float)local_c8._4_4_ * fVar31;
            fStack_f8 = fVar34 * (float)(undefined4)local_88 +
                        fVar33 * (float)local_78._0_4_ +
                        fVar32 * (float)(undefined4)local_b8 + fVar31 * (float)(undefined4)local_a8;
            fStack_f4 = fVar34 * (float)local_88._4_4_ +
                        fVar33 * (float)local_78._4_4_ +
                        fVar32 * (float)local_b8._4_4_ + fVar31 * (float)local_a8._4_4_;
            pmVar36 = vera::Light::getMVPMatrix
                                (*(Light **)(p_Var39 + 2),(mat4 *)local_130,this->m_area);
            vera::Shader::setUniform(pSVar20,&local_f0,pmVar36,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            local_130 = (undefined1  [8])&local_120;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_130,"u_projectionMatrix","");
            vera::Shader::setUniform
                      (pSVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130,(mat4 *)(*(long *)(p_Var39 + 2) + 0x148),false);
            if (local_130 != (undefined1  [8])&local_120) {
              operator_delete((void *)local_130,
                              CONCAT44(local_120._M_allocated_capacity._4_4_,
                                       local_120._M_allocated_capacity._0_4_) + 1);
            }
            local_130 = (undefined1  [8])&local_120;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"u_viewMatrix","");
            vera::Shader::setUniform
                      (pSVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130,(mat4 *)(*(long *)(p_Var39 + 2) + 0x108),false);
            if (local_130 != (undefined1  [8])&local_120) {
              operator_delete((void *)local_130,
                              CONCAT44(local_120._M_allocated_capacity._4_4_,
                                       local_120._M_allocated_capacity._0_4_) + 1);
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"u_modelMatrix","");
            local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
            local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
            local_a8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
            local_a8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
            uStack_a0 = 0;
            uVar6 = (this->m_origin).m_transformMatrix.value[1].field_0;
            uVar14 = (this->m_origin).m_transformMatrix.value[1].field_1;
            local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
            local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
            uStack_b0 = 0;
            local_98._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
            local_98._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
            uStack_90 = 0;
            local_78._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
            local_78._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
            uStack_70 = 0;
            uVar7 = (this->m_origin).m_transformMatrix.value[3].field_0;
            uVar15 = (this->m_origin).m_transformMatrix.value[3].field_1;
            local_88._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
            local_88._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
            uStack_80 = 0;
            fVar1 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
            fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
            fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
            fVar22 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
            fVar23 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
            fVar24 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
            uStack_c0 = 0;
            fVar25 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
            fVar26 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
            fVar27 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
            fStack_128 = fVar22 * (float)(undefined4)local_88 +
                         fVar3 * (float)local_78._0_4_ +
                         fVar2 * (float)(undefined4)local_b8 + fVar1 * (float)(undefined4)local_a8;
            fStack_124 = fVar22 * (float)local_88._4_4_ +
                         fVar3 * (float)local_78._4_4_ +
                         fVar2 * (float)local_b8._4_4_ + fVar1 * (float)local_a8._4_4_;
            fVar28 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
            fVar29 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
            fVar30 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
            fVar31 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
            fVar32 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
            fVar33 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
            fVar34 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
            local_130._4_4_ =
                 (float)uVar15 * fVar22 +
                 (float)local_98._4_4_ * fVar3 +
                 (float)uVar14 * fVar2 + (float)local_c8._4_4_ * fVar1;
            local_130._0_4_ =
                 (float)uVar7 * fVar22 +
                 (float)(undefined4)local_98 * fVar3 +
                 (float)uVar6 * fVar2 + (float)(undefined4)local_c8 * fVar1;
            local_120._M_allocated_capacity._0_4_ =
                 (float)uVar7 * fVar26 +
                 (float)(undefined4)local_98 * fVar25 +
                 (float)uVar6 * fVar24 + (float)(undefined4)local_c8 * fVar23;
            local_120._M_allocated_capacity._4_4_ =
                 (float)uVar15 * fVar26 +
                 (float)local_98._4_4_ * fVar25 +
                 (float)uVar14 * fVar24 + (float)local_c8._4_4_ * fVar23;
            local_120._8_4_ =
                 fVar26 * (float)(undefined4)local_88 +
                 fVar25 * (float)local_78._0_4_ +
                 fVar24 * (float)(undefined4)local_b8 + fVar23 * (float)(undefined4)local_a8;
            local_120._12_4_ =
                 fVar26 * (float)local_88._4_4_ +
                 fVar25 * (float)local_78._4_4_ +
                 fVar24 * (float)local_b8._4_4_ + fVar23 * (float)local_a8._4_4_;
            local_110 = (float)uVar7 * fVar30 +
                        (float)(undefined4)local_98 * fVar29 +
                        (float)uVar6 * fVar28 + (float)(undefined4)local_c8 * fVar27;
            fStack_10c = (float)uVar15 * fVar30 +
                         (float)local_98._4_4_ * fVar29 +
                         (float)uVar14 * fVar28 + (float)local_c8._4_4_ * fVar27;
            fStack_108 = fVar30 * (float)(undefined4)local_88 +
                         fVar29 * (float)local_78._0_4_ +
                         fVar28 * (float)(undefined4)local_b8 + fVar27 * (float)(undefined4)local_a8
            ;
            fStack_104 = fVar30 * (float)local_88._4_4_ +
                         fVar29 * (float)local_78._4_4_ +
                         fVar28 * (float)local_b8._4_4_ + fVar27 * (float)local_a8._4_4_;
            local_100 = (float)uVar7 * fVar34 +
                        (float)(undefined4)local_98 * fVar33 +
                        (float)uVar6 * fVar32 + (float)(undefined4)local_c8 * fVar31;
            fStack_fc = (float)uVar15 * fVar34 +
                        (float)local_98._4_4_ * fVar33 +
                        (float)uVar14 * fVar32 + (float)local_c8._4_4_ * fVar31;
            fStack_f8 = fVar34 * (float)(undefined4)local_88 +
                        fVar33 * (float)local_78._0_4_ +
                        fVar32 * (float)(undefined4)local_b8 + fVar31 * (float)(undefined4)local_a8;
            fStack_f4 = fVar34 * (float)local_88._4_4_ +
                        fVar33 * (float)local_78._4_4_ +
                        fVar32 * (float)local_b8._4_4_ + fVar31 * (float)local_a8._4_4_;
            vera::Shader::setUniform(pSVar20,&local_f0,(mat4 *)local_130,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            local_130 = (undefined1  [8])&local_120;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"u_model","");
            vera::Shader::setUniform
                      (pSVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130,
                       (this->m_origin).m_position.field_0.x +
                       (this->m_floor).super_Node.m_position.field_0.x,
                       (this->m_origin).m_position.field_1.y +
                       (this->m_floor).super_Node.m_position.field_1.y,
                       (this->m_origin).m_position.field_2.z +
                       (this->m_floor).super_Node.m_position.field_2.z);
            if (local_130 != (undefined1  [8])&local_120) {
              operator_delete((void *)local_130,
                              CONCAT44(local_120._M_allocated_capacity._4_4_,
                                       local_120._M_allocated_capacity._0_4_) + 1);
            }
            vera::Model::render(local_48,pSVar20);
            if ((_uniforms->tracker).m_running == true) {
              local_130 = (undefined1  [8])&local_120;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_130,"render:scene:shadowmap:floor","");
              Tracker::end(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_130);
              if (local_130 != (undefined1  [8])&local_120) {
                operator_delete((void *)local_130,
                                CONCAT44(local_120._M_allocated_capacity._4_4_,
                                         local_120._M_allocated_capacity._0_4_) + 1);
              }
            }
          }
          p_Var38 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          local_78 = p_Var39;
          if (p_Var38 != local_60) {
            do {
              lVar21 = *(long *)(p_Var38 + 2);
              local_130 = (undefined1  [8])&local_120;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"shadow","");
              ppSVar35 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                       *)(lVar21 + 600),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130);
              pSVar20 = *ppSVar35;
              if (local_130 != (undefined1  [8])&local_120) {
                operator_delete((void *)local_130,
                                CONCAT44(local_120._M_allocated_capacity._4_4_,
                                         local_120._M_allocated_capacity._0_4_) + 1);
              }
              if (pSVar20 != (Shader *)0x0) {
                if ((_uniforms->tracker).m_running == true) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_130,"render:scene:shadowmap:",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(*(long *)(p_Var38 + 2) + 0x2b0));
                  Tracker::begin(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_130);
                  if (local_130 != (undefined1  [8])&local_120) {
                    operator_delete((void *)local_130,
                                    CONCAT44(local_120._M_allocated_capacity._4_4_,
                                             local_120._M_allocated_capacity._0_4_) + 1);
                  }
                }
                vera::Shader::use(pSVar20);
                (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar20,0);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"u_modelViewProjectionMatrix","");
                this_00 = *(Light **)(local_78 + 2);
                pfVar37 = (float *)(**(code **)(**(long **)(p_Var38 + 2) + 0x100))();
                local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
                local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
                local_a8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
                local_a8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
                uStack_a0 = 0;
                uVar8 = (this->m_origin).m_transformMatrix.value[1].field_0;
                uVar16 = (this->m_origin).m_transformMatrix.value[1].field_1;
                local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
                local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
                uStack_b0 = 0;
                local_98._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
                local_98._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
                uStack_90 = 0;
                local_88._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
                local_88._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
                uStack_80 = 0;
                uVar9 = (this->m_origin).m_transformMatrix.value[3].field_0;
                uVar17 = (this->m_origin).m_transformMatrix.value[3].field_1;
                local_58._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
                local_58._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
                uStack_50 = 0;
                fVar22 = *pfVar37;
                fVar23 = pfVar37[1];
                fVar24 = pfVar37[2];
                fVar25 = pfVar37[3];
                fVar26 = pfVar37[4];
                fVar27 = pfVar37[5];
                uStack_c0 = 0;
                fVar28 = pfVar37[6];
                fVar29 = pfVar37[7];
                fVar30 = pfVar37[8];
                fStack_128 = fVar25 * (float)(undefined4)local_58 +
                             fVar24 * (float)(undefined4)local_88 +
                             fVar23 * (float)(undefined4)local_b8 +
                             fVar22 * (float)(undefined4)local_a8;
                fStack_124 = fVar25 * (float)local_58._4_4_ +
                             fVar24 * (float)local_88._4_4_ +
                             fVar23 * (float)local_b8._4_4_ + fVar22 * (float)local_a8._4_4_;
                fVar31 = pfVar37[9];
                fVar32 = pfVar37[10];
                fVar33 = pfVar37[0xb];
                fVar34 = pfVar37[0xc];
                fVar1 = pfVar37[0xd];
                fVar2 = pfVar37[0xe];
                fVar3 = pfVar37[0xf];
                local_130._4_4_ =
                     (float)uVar17 * fVar25 +
                     (float)local_98._4_4_ * fVar24 +
                     (float)uVar16 * fVar23 + (float)local_c8._4_4_ * fVar22;
                local_130._0_4_ =
                     (float)uVar9 * fVar25 +
                     (float)(undefined4)local_98 * fVar24 +
                     (float)uVar8 * fVar23 + (float)(undefined4)local_c8 * fVar22;
                local_120._M_allocated_capacity._0_4_ =
                     (float)uVar9 * fVar29 +
                     (float)(undefined4)local_98 * fVar28 +
                     (float)uVar8 * fVar27 + (float)(undefined4)local_c8 * fVar26;
                local_120._M_allocated_capacity._4_4_ =
                     (float)uVar17 * fVar29 +
                     (float)local_98._4_4_ * fVar28 +
                     (float)uVar16 * fVar27 + (float)local_c8._4_4_ * fVar26;
                local_120._8_4_ =
                     fVar29 * (float)(undefined4)local_58 +
                     fVar28 * (float)(undefined4)local_88 +
                     fVar27 * (float)(undefined4)local_b8 + fVar26 * (float)(undefined4)local_a8;
                local_120._12_4_ =
                     fVar29 * (float)local_58._4_4_ +
                     fVar28 * (float)local_88._4_4_ +
                     fVar27 * (float)local_b8._4_4_ + fVar26 * (float)local_a8._4_4_;
                local_110 = (float)uVar9 * fVar33 +
                            (float)(undefined4)local_98 * fVar32 +
                            (float)uVar8 * fVar31 + (float)(undefined4)local_c8 * fVar30;
                fStack_10c = (float)uVar17 * fVar33 +
                             (float)local_98._4_4_ * fVar32 +
                             (float)uVar16 * fVar31 + (float)local_c8._4_4_ * fVar30;
                fStack_108 = fVar33 * (float)(undefined4)local_58 +
                             fVar32 * (float)(undefined4)local_88 +
                             fVar31 * (float)(undefined4)local_b8 +
                             fVar30 * (float)(undefined4)local_a8;
                fStack_104 = fVar33 * (float)local_58._4_4_ +
                             fVar32 * (float)local_88._4_4_ +
                             fVar31 * (float)local_b8._4_4_ + fVar30 * (float)local_a8._4_4_;
                local_100 = (float)uVar9 * fVar3 +
                            (float)(undefined4)local_98 * fVar2 +
                            (float)uVar8 * fVar1 + (float)(undefined4)local_c8 * fVar34;
                fStack_fc = (float)uVar17 * fVar3 +
                            (float)local_98._4_4_ * fVar2 +
                            (float)uVar16 * fVar1 + (float)local_c8._4_4_ * fVar34;
                fStack_f8 = fVar3 * (float)(undefined4)local_58 +
                            fVar2 * (float)(undefined4)local_88 +
                            fVar1 * (float)(undefined4)local_b8 +
                            fVar34 * (float)(undefined4)local_a8;
                fStack_f4 = fVar3 * (float)local_58._4_4_ +
                            fVar2 * (float)local_88._4_4_ +
                            fVar1 * (float)local_b8._4_4_ + fVar34 * (float)local_a8._4_4_;
                pmVar36 = vera::Light::getMVPMatrix(this_00,(mat4 *)local_130,this->m_area);
                vera::Shader::setUniform(pSVar20,&local_f0,pmVar36,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                local_130 = (undefined1  [8])&local_120;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_130,"u_projectionMatrix","");
                p_Var39 = local_78;
                vera::Shader::setUniform
                          (pSVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_130,(mat4 *)(*(long *)(local_78 + 2) + 0x148),false);
                if (local_130 != (undefined1  [8])&local_120) {
                  operator_delete((void *)local_130,
                                  CONCAT44(local_120._M_allocated_capacity._4_4_,
                                           local_120._M_allocated_capacity._0_4_) + 1);
                }
                local_130 = (undefined1  [8])&local_120;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_130,"u_viewMatrix","");
                vera::Shader::setUniform
                          (pSVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_130,(mat4 *)(*(long *)(p_Var39 + 2) + 0x108),false);
                if (local_130 != (undefined1  [8])&local_120) {
                  operator_delete((void *)local_130,
                                  CONCAT44(local_120._M_allocated_capacity._4_4_,
                                           local_120._M_allocated_capacity._0_4_) + 1);
                }
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"u_modelMatrix","");
                pfVar37 = (float *)(**(code **)(**(long **)(p_Var38 + 2) + 0x100))();
                local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
                local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
                local_a8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
                local_a8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
                uStack_a0 = 0;
                uVar10 = (this->m_origin).m_transformMatrix.value[1].field_0;
                uVar18 = (this->m_origin).m_transformMatrix.value[1].field_1;
                local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
                local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
                uStack_b0 = 0;
                local_98._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
                local_98._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
                uStack_90 = 0;
                local_88._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
                local_88._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
                uStack_80 = 0;
                uVar11 = (this->m_origin).m_transformMatrix.value[3].field_0;
                uVar19 = (this->m_origin).m_transformMatrix.value[3].field_1;
                local_58._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
                local_58._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
                uStack_50 = 0;
                fVar22 = *pfVar37;
                fVar23 = pfVar37[1];
                fVar24 = pfVar37[2];
                fVar25 = pfVar37[3];
                fVar26 = pfVar37[4];
                fVar27 = pfVar37[5];
                uStack_c0 = 0;
                fVar28 = pfVar37[6];
                fVar29 = pfVar37[7];
                fVar30 = pfVar37[8];
                fStack_128 = fVar25 * (float)(undefined4)local_58 +
                             fVar24 * (float)(undefined4)local_88 +
                             fVar23 * (float)(undefined4)local_b8 +
                             fVar22 * (float)(undefined4)local_a8;
                fStack_124 = fVar25 * (float)local_58._4_4_ +
                             fVar24 * (float)local_88._4_4_ +
                             fVar23 * (float)local_b8._4_4_ + fVar22 * (float)local_a8._4_4_;
                fVar31 = pfVar37[9];
                fVar32 = pfVar37[10];
                fVar33 = pfVar37[0xb];
                fVar34 = pfVar37[0xc];
                fVar1 = pfVar37[0xd];
                fVar2 = pfVar37[0xe];
                fVar3 = pfVar37[0xf];
                local_130._4_4_ =
                     (float)uVar19 * fVar25 +
                     (float)local_98._4_4_ * fVar24 +
                     (float)uVar18 * fVar23 + (float)local_c8._4_4_ * fVar22;
                local_130._0_4_ =
                     (float)uVar11 * fVar25 +
                     (float)(undefined4)local_98 * fVar24 +
                     (float)uVar10 * fVar23 + (float)(undefined4)local_c8 * fVar22;
                local_120._M_allocated_capacity._0_4_ =
                     (float)uVar11 * fVar29 +
                     (float)(undefined4)local_98 * fVar28 +
                     (float)uVar10 * fVar27 + (float)(undefined4)local_c8 * fVar26;
                local_120._M_allocated_capacity._4_4_ =
                     (float)uVar19 * fVar29 +
                     (float)local_98._4_4_ * fVar28 +
                     (float)uVar18 * fVar27 + (float)local_c8._4_4_ * fVar26;
                local_120._8_4_ =
                     fVar29 * (float)(undefined4)local_58 +
                     fVar28 * (float)(undefined4)local_88 +
                     fVar27 * (float)(undefined4)local_b8 + fVar26 * (float)(undefined4)local_a8;
                local_120._12_4_ =
                     fVar29 * (float)local_58._4_4_ +
                     fVar28 * (float)local_88._4_4_ +
                     fVar27 * (float)local_b8._4_4_ + fVar26 * (float)local_a8._4_4_;
                local_110 = (float)uVar11 * fVar33 +
                            (float)(undefined4)local_98 * fVar32 +
                            (float)uVar10 * fVar31 + (float)(undefined4)local_c8 * fVar30;
                fStack_10c = (float)uVar19 * fVar33 +
                             (float)local_98._4_4_ * fVar32 +
                             (float)uVar18 * fVar31 + (float)local_c8._4_4_ * fVar30;
                fStack_108 = fVar33 * (float)(undefined4)local_58 +
                             fVar32 * (float)(undefined4)local_88 +
                             fVar31 * (float)(undefined4)local_b8 +
                             fVar30 * (float)(undefined4)local_a8;
                fStack_104 = fVar33 * (float)local_58._4_4_ +
                             fVar32 * (float)local_88._4_4_ +
                             fVar31 * (float)local_b8._4_4_ + fVar30 * (float)local_a8._4_4_;
                local_100 = (float)uVar11 * fVar3 +
                            (float)(undefined4)local_98 * fVar2 +
                            (float)uVar10 * fVar1 + (float)(undefined4)local_c8 * fVar34;
                fStack_fc = (float)uVar19 * fVar3 +
                            (float)local_98._4_4_ * fVar2 +
                            (float)uVar18 * fVar1 + (float)local_c8._4_4_ * fVar34;
                fStack_f8 = fVar3 * (float)(undefined4)local_58 +
                            fVar2 * (float)(undefined4)local_88 +
                            fVar1 * (float)(undefined4)local_b8 +
                            fVar34 * (float)(undefined4)local_a8;
                fStack_f4 = fVar3 * (float)local_58._4_4_ +
                            fVar2 * (float)local_88._4_4_ +
                            fVar1 * (float)local_b8._4_4_ + fVar34 * (float)local_a8._4_4_;
                vera::Shader::setUniform(pSVar20,&local_f0,(mat4 *)local_130,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                local_130 = (undefined1  [8])&local_120;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"u_model","");
                pfVar37 = (float *)(**(code **)(**(long **)(p_Var38 + 2) + 0x98))();
                vera::Shader::setUniform
                          (pSVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_130,(this->m_origin).m_position.field_0.x + *pfVar37,
                           (this->m_origin).m_position.field_1.y + pfVar37[1],
                           (this->m_origin).m_position.field_2.z + pfVar37[2]);
                if (local_130 != (undefined1  [8])&local_120) {
                  operator_delete((void *)local_130,
                                  CONCAT44(local_120._M_allocated_capacity._4_4_,
                                           local_120._M_allocated_capacity._0_4_) + 1);
                }
                vera::Model::render(*(Model **)(p_Var38 + 2),pSVar20);
                if ((_uniforms->tracker).m_running == true) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_130,"render:scene:shadowmap:",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(*(long *)(p_Var38 + 2) + 0x2b0));
                  Tracker::end(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_130);
                  if (local_130 != (undefined1  [8])&local_120) {
                    operator_delete((void *)local_130,
                                    CONCAT44(local_120._M_allocated_capacity._4_4_,
                                             local_120._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
              p_Var38 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var38);
            } while (p_Var38 != local_60);
          }
          p_Var39 = local_78;
          vera::Light::unbindShadowMap(*(Light **)(local_78 + 2));
        }
        p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
      } while (p_Var39 != local_38);
    }
    if ((_uniforms->tracker).m_running != false) {
      local_130 = (undefined1  [8])&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"shadowmap","");
      Tracker::end(local_d0,(string *)local_130);
      if (local_130 != (undefined1  [8])&local_120) {
        operator_delete((void *)local_130,
                        CONCAT44(local_120._M_allocated_capacity._4_4_,
                                 local_120._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  return;
}

Assistant:

void SceneRender::renderShadowMap(Uniforms& _uniforms) {
    if (!m_shadows)
        return;

    TRACK_BEGIN("render:scene:shadowmap")
    vera::Shader* shadowShader = nullptr;
    for (vera::LightsMap::iterator lit = _uniforms.lights.begin(); lit != _uniforms.lights.end(); ++lit) {
        if (dynamicShadows ||  lit->second->bChange || haveChange() ) {
            // Temporally move the MVP matrix from the view of the light 
            glm::mat4 m = m_origin.getTransformMatrix();
            // glm::mat4 p = lit->second->getProjectionMatrix();
            // glm::mat4 v = lit->second->getViewMatrix();
            
            lit->second->bindShadowMap();

            shadowShader = m_floor.getBufferShader("shadow");
            if (m_floor.getVbo() && shadowShader != nullptr) {
                TRACK_BEGIN("render:scene:shadowmap:floor")
                shadowShader->use();
                _uniforms.feedTo( shadowShader, false );
                shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * m_floor.getTransformMatrix(), m_area ) );
                shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                shadowShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                m_floor.render(shadowShader);
                TRACK_END("render:scene:shadowmap:floor")
            }

            for (vera::ModelsMap::iterator mit = _uniforms.models.begin(); mit != _uniforms.models.end(); ++mit) {
                shadowShader = mit->second->getBufferShader("shadow");
                if (shadowShader != nullptr) {
                    TRACK_BEGIN("render:scene:shadowmap:" + mit->second->getName())

                    // bind the shader
                    shadowShader->use();

                    // Update Uniforms and textures variables to the shader
                    _uniforms.feedTo( shadowShader, false );

                    // Pass special uniforms
                    shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * mit->second->getTransformMatrix(), m_area ) );
                    shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                    shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                    shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * mit->second->getTransformMatrix() );
                    shadowShader->setUniform( "u_model", m_origin.getPosition() + mit->second->getPosition() );
                    mit->second->render(shadowShader);

                    TRACK_END("render:scene:shadowmap:" + mit->second->getName())
                }
            }

            lit->second->unbindShadowMap();
        }
    }
    TRACK_END("shadowmap")
}